

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  int *piVar1;
  ushort uVar2;
  u32 uVar3;
  Pgno PVar4;
  BtShared *pBt_00;
  u8 *puVar5;
  Pager *pPVar6;
  Wal *pWVar7;
  sqlite3 *psVar8;
  _func_int_void_ptr_int *p_Var9;
  sqlite3_mutex *psVar10;
  MemPage *pMVar11;
  uint uVar12;
  bool bVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  BtLock *pBVar18;
  int iVar19;
  Btree *pBVar20;
  u16 uVar21;
  uint uVar22;
  BtShared *pBt;
  uint uVar23;
  undefined1 auVar24 [16];
  MemPage *pPage1;
  int local_44;
  u32 *local_40;
  MemPage *local_38;
  
  pBt_00 = p->pBt;
  sqlite3BtreeEnter(p);
  iVar15 = 0;
  if (((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) ||
     ((uVar2 = pBt_00->btsFlags, wrflag != 0 && (iVar15 = 8, (uVar2 & 1) != 0)))) goto LAB_0014b4a7;
  if (wrflag == 0) {
    if ((uVar2 & 0x40) == 0) goto LAB_0014ae2f;
LAB_0014ae4f:
    pBVar20 = pBt_00->pWriter;
LAB_0014ae53:
    iVar15 = 0x106;
    if (pBVar20->db != (sqlite3 *)0x0) goto LAB_0014b4a7;
  }
  else {
    if (((uVar2 & 0x40) != 0) || (pBt_00->inTransaction == '\x02')) goto LAB_0014ae4f;
LAB_0014ae2f:
    if (1 < wrflag) {
      for (pBVar18 = pBt_00->pLock; pBVar18 != (BtLock *)0x0; pBVar18 = pBVar18->pNext) {
        pBVar20 = pBVar18->pBtree;
        if (pBVar20 != p) goto LAB_0014ae53;
      }
    }
  }
  iVar15 = querySharedCacheTableLock(p,1,'\x01');
  if (iVar15 == 0) {
    uVar2 = pBt_00->btsFlags;
    pBt_00->btsFlags = uVar2 & 0xfff7;
    if (pBt_00->nPage == 0) {
      pBt_00->btsFlags = uVar2 | 8;
    }
    local_40 = &pBt_00->pageSize;
    iVar15 = 0;
    do {
      iVar17 = iVar15;
      if (pBt_00->pPage1 == (MemPage *)0x0) {
        do {
          iVar15 = sqlite3PagerSharedLock(pBt_00->pPager);
          if ((iVar15 == 0) &&
             (iVar15 = btreeGetPage(pBt_00,1,&local_38,0,0), pMVar11 = local_38, iVar15 == 0)) {
            puVar5 = local_38->aData;
            uVar23 = *(uint *)(puVar5 + 0x1c);
            uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                     uVar23 << 0x18;
            uVar3 = pBt_00->pPager->dbSize;
            if ((uVar23 == 0) || (*(int *)(puVar5 + 0x18) != *(int *)(puVar5 + 0x5c))) {
              uVar23 = uVar3;
            }
            if ((int)uVar23 < 1) {
LAB_0014af35:
              uVar3 = pBt_00->usableSize;
              uVar16 = (uVar3 * 0x40 - 0x300) / 0xff - 0x17;
              pBt_00->maxLocal = (u16)uVar16;
              uVar21 = (short)((uVar3 * 0x20 - 0x180) / 0xff) - 0x17;
              pBt_00->minLocal = uVar21;
              pBt_00->maxLeaf = (short)uVar3 - 0x23;
              pBt_00->minLeaf = uVar21;
              if ((uVar16 & 0xffff) < 0x80) {
                pBt_00->max1bytePayload = (u8)uVar16;
              }
              else {
                pBt_00->max1bytePayload = '\x7f';
              }
              pBt_00->pPage1 = pMVar11;
              pBt_00->nPage = uVar23;
              iVar15 = 0;
            }
            else {
              auVar24[0] = -(*puVar5 == 'S');
              auVar24[1] = -(puVar5[1] == 'Q');
              auVar24[2] = -(puVar5[2] == 'L');
              auVar24[3] = -(puVar5[3] == 'i');
              auVar24[4] = -(puVar5[4] == 't');
              auVar24[5] = -(puVar5[5] == 'e');
              auVar24[6] = -(puVar5[6] == ' ');
              auVar24[7] = -(puVar5[7] == 'f');
              auVar24[8] = -(puVar5[8] == 'o');
              auVar24[9] = -(puVar5[9] == 'r');
              auVar24[10] = -(puVar5[10] == 'm');
              auVar24[0xb] = -(puVar5[0xb] == 'a');
              auVar24[0xc] = -(puVar5[0xc] == 't');
              auVar24[0xd] = -(puVar5[0xd] == ' ');
              auVar24[0xe] = -(puVar5[0xe] == '3');
              auVar24[0xf] = -(puVar5[0xf] == '\0');
              iVar15 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar5[0x12]) {
                  *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags | 1;
                }
                if (2 < puVar5[0x13]) goto LAB_0014af23;
                if ((puVar5[0x13] == 2) && ((pBt_00->btsFlags & 0x10) == 0)) {
                  local_44 = 0;
                  iVar15 = sqlite3PagerOpenWal(pBt_00->pPager,&local_44);
                  if (iVar15 == 0) {
                    if (local_44 == 0) {
                      if (pMVar11 != (MemPage *)0x0) {
                        sqlite3PagerUnref(pMVar11->pDbPage);
                      }
                      iVar19 = 1;
                      bVar13 = false;
                      iVar15 = 0;
                    }
                    else {
                      iVar15 = 0x1a;
                      iVar19 = 0;
                      bVar13 = true;
                    }
                  }
                  else {
                    iVar19 = 2;
                    bVar13 = false;
                  }
                  iVar17 = 0;
                  if (bVar13) goto LAB_0014b04b;
                  goto LAB_0014af28;
                }
LAB_0014b04b:
                if (puVar5[0x17] == ' ' && *(short *)(puVar5 + 0x15) == 0x2040) {
                  uVar12 = (uint)puVar5[0x10] * 0x100;
                  uVar16 = (uint)puVar5[0x11] * 0x10000;
                  if (((uVar16 + uVar12) - 0x10001 < 0xffff0100) ||
                     (uVar22 = uVar16 | uVar12, ((uVar12 + uVar16) - 1 & uVar22) != 0))
                  goto LAB_0014b067;
                  bVar14 = puVar5[0x14];
                  uVar16 = uVar22 - bVar14;
                  if (uVar22 == *local_40) {
                    if (((pBt_00->db->flags & 0x8000) == 0) && ((int)uVar3 < (int)uVar23)) {
                      sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xcb33,
                                  "118a3b35693b134d56ebd780123b7fd6f1497668");
                      iVar15 = 0xb;
                    }
                    else if (0x1df < uVar16) {
                      pBt_00->pageSize = uVar22;
                      pBt_00->usableSize = uVar16;
                      uVar16 = *(uint *)(puVar5 + 0x34);
                      pBt_00->autoVacuum =
                           ((uVar16 >> 0x18 != 0 || (uVar16 & 0xff0000) != 0) ||
                           (uVar16 & 0xff00) != 0) || (uVar16 & 0xff) != 0;
                      uVar16 = *(uint *)(puVar5 + 0x40);
                      pBt_00->incrVacuum =
                           ((uVar16 >> 0x18 != 0 || (uVar16 & 0xff0000) != 0) ||
                           (uVar16 & 0xff00) != 0) || (uVar16 & 0xff) != 0;
                      iVar19 = 0;
                      iVar17 = 0;
                      goto LAB_0014af28;
                    }
                    goto LAB_0014b067;
                  }
                  if (pMVar11 != (MemPage *)0x0) {
                    sqlite3PagerUnref(pMVar11->pDbPage);
                  }
                  pBt_00->usableSize = uVar16;
                  pBt_00->pageSize = uVar22;
                  pcache1Free(pBt_00->pTmpSpace);
                  pBt_00->pTmpSpace = (u8 *)0x0;
                  iVar15 = sqlite3PagerSetPagesize(pBt_00->pPager,local_40,(uint)bVar14);
                  iVar19 = 1;
                  iVar17 = iVar15;
                }
                else {
LAB_0014b067:
                  iVar19 = 2;
                  iVar17 = 0;
                }
              }
              else {
LAB_0014af23:
                iVar19 = 2;
              }
LAB_0014af28:
              if (iVar19 == 2) {
                if (pMVar11 != (MemPage *)0x0) {
                  sqlite3PagerUnref(pMVar11->pDbPage);
                }
                pBt_00->pPage1 = (MemPage *)0x0;
              }
              else {
                iVar15 = iVar17;
                if (iVar19 == 0) goto LAB_0014af35;
              }
            }
          }
          if (iVar15 != 0) goto LAB_0014b1e1;
          iVar17 = iVar15;
        } while (pBt_00->pPage1 == (MemPage *)0x0);
        iVar15 = 0;
      }
LAB_0014b1e1:
      if (((wrflag != 0) && (iVar15 == 0)) && (iVar15 = 8, (pBt_00->btsFlags & 1) == 0)) {
        pPVar6 = pBt_00->pPager;
        iVar15 = pPVar6->errCode;
        if (iVar15 == 0) {
          pPVar6->subjInMemory = p->db->temp_store == '\x02';
          iVar15 = 0;
          if (pPVar6->eState == '\x01') {
            if (pPVar6->pWal == (Wal *)0x0) {
              if ((pPVar6->eLock < 6) && ((0x23U >> (pPVar6->eLock & 0x1f) & 1) != 0)) {
                iVar15 = (*pPVar6->fd->pMethods->xLock)(pPVar6->fd,2);
                if (iVar15 == 0) {
                  if (pPVar6->eLock != '\x05') {
                    pPVar6->eLock = '\x02';
                  }
                  goto LAB_0014b320;
                }
              }
              else {
LAB_0014b320:
                iVar15 = 0;
              }
              if ((1 < wrflag) && (iVar15 == 0)) {
                do {
                  iVar15 = 0;
                  if (((pPVar6->eLock < 4) || (pPVar6->eLock == 5)) &&
                     (iVar15 = (*pPVar6->fd->pMethods->xLock)(pPVar6->fd,4), iVar15 == 0)) {
                    pPVar6->eLock = '\x04';
                    iVar15 = 0;
                  }
                } while ((iVar15 == 5) &&
                        (iVar17 = (*pPVar6->xBusyHandler)(pPVar6->pBusyHandlerArg), iVar17 != 0));
              }
            }
            else {
              if ((pPVar6->exclusiveMode != '\0') && (pPVar6->pWal->exclusiveMode == '\0')) {
                iVar15 = 0;
                if (((pPVar6->eLock < 4) || (pPVar6->eLock == 5)) &&
                   (iVar15 = (*pPVar6->fd->pMethods->xLock)(pPVar6->fd,4), iVar15 == 0)) {
                  pPVar6->eLock = '\x04';
                  iVar15 = 0;
                }
                if (iVar15 != 0) goto LAB_0014b418;
                pWVar7 = pPVar6->pWal;
                if (pWVar7->exclusiveMode == '\0') {
                  (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,pWVar7->readLock + 3,1,5);
                }
                pWVar7->exclusiveMode = '\x01';
              }
              pWVar7 = pPVar6->pWal;
              iVar15 = 8;
              if (pWVar7->readOnly == '\0') {
                iVar15 = 0;
                if (pWVar7->exclusiveMode == '\0') {
                  iVar15 = (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,0,1,10);
                }
                if (iVar15 == 0) {
                  pWVar7->writeLock = '\x01';
                  iVar15 = bcmp(&pWVar7->hdr,*pWVar7->apWiData,0x30);
                  if (iVar15 == 0) {
                    iVar15 = 0;
                  }
                  else {
                    if (pWVar7->exclusiveMode == '\0') {
                      (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,0,1,9);
                    }
                    pWVar7->writeLock = '\0';
                    iVar15 = 5;
                  }
                }
              }
            }
            if (iVar15 == 0) {
              pPVar6->eState = '\x02';
              PVar4 = pPVar6->dbSize;
              pPVar6->dbHintSize = PVar4;
              pPVar6->dbFileSize = PVar4;
              pPVar6->dbOrigSize = PVar4;
              pPVar6->journalOff = 0;
              iVar15 = 0;
            }
          }
        }
LAB_0014b418:
        if (iVar15 == 0) {
          iVar15 = newDatabase(pBt_00);
        }
      }
      if (((iVar15 != 0) && (pBt_00->inTransaction == '\0')) && (pBt_00->pPage1 != (MemPage *)0x0))
      {
        sqlite3PagerUnref(pBt_00->pPage1->pDbPage);
        pBt_00->pPage1 = (MemPage *)0x0;
      }
      if (((char)iVar15 != '\x05') || (pBt_00->inTransaction != '\0')) goto LAB_0014b4a2;
      psVar8 = pBt_00->db;
      p_Var9 = (psVar8->busyHandler).xFunc;
      if ((p_Var9 == (_func_int_void_ptr_int *)0x0) ||
         (iVar17 = (psVar8->busyHandler).nBusy, iVar17 < 0)) goto LAB_0014b4a2;
      iVar17 = (*p_Var9)((psVar8->busyHandler).pArg,iVar17);
      if (iVar17 == 0) {
        iVar19 = -1;
      }
      else {
        iVar19 = (psVar8->busyHandler).nBusy + 1;
      }
      (psVar8->busyHandler).nBusy = iVar19;
      if (iVar17 == 0) goto LAB_0014b4a2;
    } while( true );
  }
LAB_0014b4a7:
  if ((wrflag != 0) && (iVar15 == 0)) {
    iVar15 = sqlite3PagerOpenSavepoint(pBt_00->pPager,p->db->nSavepoint);
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar10 = p->pBt->mutex;
      if (psVar10 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar10);
      }
      p->locked = '\0';
    }
  }
  return iVar15;
LAB_0014b4a2:
  if (iVar15 == 0) {
    if ((p->inTrans == '\0') &&
       (pBt_00->nTransaction = pBt_00->nTransaction + 1, p->sharable != '\0')) {
      (p->lock).eLock = '\x01';
      (p->lock).pNext = pBt_00->pLock;
      pBt_00->pLock = &p->lock;
    }
    bVar14 = 2 - (wrflag == 0);
    p->inTrans = bVar14;
    if (pBt_00->inTransaction < bVar14) {
      pBt_00->inTransaction = bVar14;
    }
    iVar15 = 0;
    if (wrflag != 0) {
      pMVar11 = pBt_00->pPage1;
      pBt_00->pWriter = p;
      pBt_00->btsFlags = (ushort)(1 < wrflag) << 5 | pBt_00->btsFlags & 0xffdf;
      uVar23 = *(uint *)(pMVar11->aData + 0x1c);
      iVar15 = 0;
      if ((pBt_00->nPage !=
           (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18)) &&
         (iVar15 = sqlite3PagerWrite(pMVar11->pDbPage), iVar15 == 0)) {
        uVar23 = pBt_00->nPage;
        *(uint *)(pMVar11->aData + 0x1c) =
             uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
        iVar15 = 0;
      }
    }
  }
  goto LAB_0014b4a7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  sqlite3 *pBlock = 0;
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  /* If another database handle has already opened a write transaction 
  ** on this shared-btree structure and a second write transaction is
  ** requested, return SQLITE_LOCKED.
  */
  if( (wrflag && pBt->inTransaction==TRANS_WRITE)
   || (pBt->btsFlags & BTS_PENDING)!=0
  ){
    pBlock = pBt->pWriter->db;
  }else if( wrflag>1 ){
    BtLock *pIter;
    for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
      if( pIter->pBtree!=p ){
        pBlock = pIter->pBtree->db;
        break;
      }
    }
  }
  if( pBlock ){
    sqlite3ConnectionBlocked(p->db, pBlock);
    rc = SQLITE_LOCKED_SHAREDCACHE;
    goto trans_begun;
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}